

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

bool EvaluateToBuffer(InstructionVMEvalContext *ctx,VmModule *module,char *resultBuf,
                     uint resultBufSize)

{
  VmValueType VVar1;
  uint uVar2;
  VmConstant *pVVar3;
  
  pVVar3 = EvaluateModule(ctx,module);
  if (pVVar3 != (VmConstant *)0x0) {
    VVar1 = (pVVar3->super_VmValue).type.type;
    uVar2 = (pVVar3->super_VmValue).type.size;
    if ((VVar1 == VM_TYPE_INT) && (uVar2 == 4)) {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",(ulong)(uint)pVVar3->iValue);
    }
    else if ((VVar1 == VM_TYPE_DOUBLE) && (uVar2 == 8)) {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%f",pVVar3->dValue);
    }
    else if ((VVar1 == VM_TYPE_LONG) && (uVar2 == 8)) {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%lldL",pVVar3->lValue);
    }
    else {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"unknown");
    }
  }
  return pVVar3 != (VmConstant *)0x0;
}

Assistant:

bool EvaluateToBuffer(InstructionVMEvalContext &ctx, VmModule *module, char *resultBuf, unsigned resultBufSize)
{
	if(VmConstant *value = EvaluateModule(ctx, module))
	{
		if(value->type == VmType::Int)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", value->iValue);
		}
		else if(value->type == VmType::Double)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%f", value->dValue);
		}
		else if(value->type == VmType::Long)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%lldL", value->lValue);
		}
		else
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "unknown");
		}

		return true;
	}

	return false;
}